

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbcursor_p.cpp
# Opt level: O3

void QFbCursorDeviceListener::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  
  if ((_id == 0 && _c == InvokeMetaMethod) && (*_a[1] == 1)) {
    QFbCursor::updateMouseStatus(*(QFbCursor **)(_o + 0x10));
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QInputDeviceManager::DeviceType>::metaType;
        return;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void QFbCursorDeviceListener::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbCursorDeviceListener *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->onDeviceListChanged((*reinterpret_cast< std::add_pointer_t<QInputDeviceManager::DeviceType>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QInputDeviceManager::DeviceType >(); break;
            }
            break;
        }
    }
}